

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::get_active_uniform_block_name
               (NegativeTestContext *ctx)

{
  ostringstream *this;
  RenderContext *renderCtx;
  GLuint program_00;
  allocator<char> local_34d;
  GLint numActiveBlocks;
  GLsizei length;
  string local_328;
  string local_308;
  GLchar uniformBlockName [128];
  undefined1 local_268 [384];
  ShaderProgram program;
  
  renderCtx = ctx->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_308,
             "${GLSL_VERSION_DECL}\nuniform mediump vec4 vUnif_vec4;\nin mediump vec4 attr;layout(shared) uniform Block { mediump vec4 blockVar; };\nvoid main (void)\n{\n\tgl_Position = vUnif_vec4 + blockVar + attr;\n}\n"
             ,(allocator<char> *)&numActiveBlocks);
  getVtxFragVersionSources((string *)uniformBlockName,&local_308,ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,
             "${GLSL_VERSION_DECL}\nuniform mediump ivec4 fUnif_ivec4;\nuniform mediump uvec4 fUnif_uvec4;\nlayout(location = 0) out mediump vec4 fragColor;void main (void)\n{\n\tfragColor = vec4(vec4(fUnif_ivec4) + vec4(fUnif_uvec4));\n}\n"
             ,&local_34d);
  getVtxFragVersionSources((string *)&length,&local_328,ctx);
  glu::makeVtxFragSources((ProgramSources *)local_268,(string *)uniformBlockName,(string *)&length);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,(ProgramSources *)local_268);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_268);
  std::__cxx11::string::~string((string *)&length);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)uniformBlockName);
  std::__cxx11::string::~string((string *)&local_308);
  program_00 = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
  length = -1;
  numActiveBlocks = -1;
  uniformBlockName[0x70] = '\0';
  uniformBlockName[0x71] = '\0';
  uniformBlockName[0x72] = '\0';
  uniformBlockName[0x73] = '\0';
  uniformBlockName[0x74] = '\0';
  uniformBlockName[0x75] = '\0';
  uniformBlockName[0x76] = '\0';
  uniformBlockName[0x77] = '\0';
  uniformBlockName[0x78] = '\0';
  uniformBlockName[0x79] = '\0';
  uniformBlockName[0x7a] = '\0';
  uniformBlockName[0x7b] = '\0';
  uniformBlockName[0x7c] = '\0';
  uniformBlockName[0x7d] = '\0';
  uniformBlockName[0x7e] = '\0';
  uniformBlockName[0x7f] = '\0';
  uniformBlockName[0x60] = '\0';
  uniformBlockName[0x61] = '\0';
  uniformBlockName[0x62] = '\0';
  uniformBlockName[99] = '\0';
  uniformBlockName[100] = '\0';
  uniformBlockName[0x65] = '\0';
  uniformBlockName[0x66] = '\0';
  uniformBlockName[0x67] = '\0';
  uniformBlockName[0x68] = '\0';
  uniformBlockName[0x69] = '\0';
  uniformBlockName[0x6a] = '\0';
  uniformBlockName[0x6b] = '\0';
  uniformBlockName[0x6c] = '\0';
  uniformBlockName[0x6d] = '\0';
  uniformBlockName[0x6e] = '\0';
  uniformBlockName[0x6f] = '\0';
  uniformBlockName[0x50] = '\0';
  uniformBlockName[0x51] = '\0';
  uniformBlockName[0x52] = '\0';
  uniformBlockName[0x53] = '\0';
  uniformBlockName[0x54] = '\0';
  uniformBlockName[0x55] = '\0';
  uniformBlockName[0x56] = '\0';
  uniformBlockName[0x57] = '\0';
  uniformBlockName[0x58] = '\0';
  uniformBlockName[0x59] = '\0';
  uniformBlockName[0x5a] = '\0';
  uniformBlockName[0x5b] = '\0';
  uniformBlockName[0x5c] = '\0';
  uniformBlockName[0x5d] = '\0';
  uniformBlockName[0x5e] = '\0';
  uniformBlockName[0x5f] = '\0';
  uniformBlockName[0x40] = '\0';
  uniformBlockName[0x41] = '\0';
  uniformBlockName[0x42] = '\0';
  uniformBlockName[0x43] = '\0';
  uniformBlockName[0x44] = '\0';
  uniformBlockName[0x45] = '\0';
  uniformBlockName[0x46] = '\0';
  uniformBlockName[0x47] = '\0';
  uniformBlockName[0x48] = '\0';
  uniformBlockName[0x49] = '\0';
  uniformBlockName[0x4a] = '\0';
  uniformBlockName[0x4b] = '\0';
  uniformBlockName[0x4c] = '\0';
  uniformBlockName[0x4d] = '\0';
  uniformBlockName[0x4e] = '\0';
  uniformBlockName[0x4f] = '\0';
  uniformBlockName[0x30] = '\0';
  uniformBlockName[0x31] = '\0';
  uniformBlockName[0x32] = '\0';
  uniformBlockName[0x33] = '\0';
  uniformBlockName[0x34] = '\0';
  uniformBlockName[0x35] = '\0';
  uniformBlockName[0x36] = '\0';
  uniformBlockName[0x37] = '\0';
  uniformBlockName[0x38] = '\0';
  uniformBlockName[0x39] = '\0';
  uniformBlockName[0x3a] = '\0';
  uniformBlockName[0x3b] = '\0';
  uniformBlockName[0x3c] = '\0';
  uniformBlockName[0x3d] = '\0';
  uniformBlockName[0x3e] = '\0';
  uniformBlockName[0x3f] = '\0';
  uniformBlockName[0x20] = '\0';
  uniformBlockName[0x21] = '\0';
  uniformBlockName[0x22] = '\0';
  uniformBlockName[0x23] = '\0';
  uniformBlockName[0x24] = '\0';
  uniformBlockName[0x25] = '\0';
  uniformBlockName[0x26] = '\0';
  uniformBlockName[0x27] = '\0';
  uniformBlockName[0x28] = '\0';
  uniformBlockName[0x29] = '\0';
  uniformBlockName[0x2a] = '\0';
  uniformBlockName[0x2b] = '\0';
  uniformBlockName[0x2c] = '\0';
  uniformBlockName[0x2d] = '\0';
  uniformBlockName[0x2e] = '\0';
  uniformBlockName[0x2f] = '\0';
  uniformBlockName[0x10] = '\0';
  uniformBlockName[0x11] = '\0';
  uniformBlockName[0x12] = '\0';
  uniformBlockName[0x13] = '\0';
  uniformBlockName[0x14] = '\0';
  uniformBlockName[0x15] = '\0';
  uniformBlockName[0x16] = '\0';
  uniformBlockName[0x17] = '\0';
  uniformBlockName[0x18] = '\0';
  uniformBlockName[0x19] = '\0';
  uniformBlockName[0x1a] = '\0';
  uniformBlockName[0x1b] = '\0';
  uniformBlockName[0x1c] = '\0';
  uniformBlockName[0x1d] = '\0';
  uniformBlockName[0x1e] = '\0';
  uniformBlockName[0x1f] = '\0';
  uniformBlockName[0] = '\0';
  uniformBlockName[1] = '\0';
  uniformBlockName[2] = '\0';
  uniformBlockName[3] = '\0';
  uniformBlockName[4] = '\0';
  uniformBlockName[5] = '\0';
  uniformBlockName[6] = '\0';
  uniformBlockName[7] = '\0';
  uniformBlockName[8] = '\0';
  uniformBlockName[9] = '\0';
  uniformBlockName[10] = '\0';
  uniformBlockName[0xb] = '\0';
  uniformBlockName[0xc] = '\0';
  uniformBlockName[0xd] = '\0';
  uniformBlockName[0xe] = '\0';
  uniformBlockName[0xf] = '\0';
  glu::CallLogWrapper::glGetProgramiv
            (&ctx->super_CallLogWrapper,program.m_program.m_program,0x8a36,&numActiveBlocks);
  local_268._0_8_ = (ctx->super_CallLogWrapper).m_log;
  this = (ostringstream *)(local_268 + 8);
  std::__cxx11::ostringstream::ostringstream(this);
  std::operator<<((ostream *)this,"// GL_ACTIVE_UNIFORM_BLOCKS = ");
  std::ostream::operator<<(this,numActiveBlocks);
  std::operator<<((ostream *)this," (expected 1).");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this);
  NegativeTestContext::expectError(ctx,0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_268,
             "GL_INVALID_OPERATION is generated if program is the name of a shader object.",
             &local_34d);
  NegativeTestContext::beginSection(ctx,(string *)local_268);
  std::__cxx11::string::~string((string *)local_268);
  glu::CallLogWrapper::glGetActiveUniformBlockName
            (&ctx->super_CallLogWrapper,program_00,numActiveBlocks,0x8a3f,&length,uniformBlockName);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_268,
             "GL_INVALID_VALUE is generated if program is not the name of either a program or shader object."
             ,&local_34d);
  NegativeTestContext::beginSection(ctx,(string *)local_268);
  std::__cxx11::string::~string((string *)local_268);
  glu::CallLogWrapper::glGetActiveUniformBlockName
            (&ctx->super_CallLogWrapper,0xffffffff,numActiveBlocks,0x8a3f,&length,uniformBlockName);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_268,
             "GL_INVALID_VALUE is generated if uniformBlockIndex is greater than or equal to the value of GL_ACTIVE_UNIFORM_BLOCKS or is not the index of an active uniform block in program."
             ,&local_34d);
  NegativeTestContext::beginSection(ctx,(string *)local_268);
  std::__cxx11::string::~string((string *)local_268);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,program.m_program.m_program);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glGetActiveUniformBlockName
            (&ctx->super_CallLogWrapper,program.m_program.m_program,numActiveBlocks,0x80,&length,
             uniformBlockName);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
  glu::ShaderProgram::~ShaderProgram(&program);
  return;
}

Assistant:

void get_active_uniform_block_name (NegativeTestContext& ctx)
{
	glu::ShaderProgram	program			(ctx.getRenderContext(), glu::makeVtxFragSources(getVtxFragVersionSources(uniformTestVertSource, ctx), getVtxFragVersionSources(uniformTestFragSource, ctx)));
	GLuint				shader			= ctx.glCreateShader(GL_VERTEX_SHADER);
	GLsizei				length			= -1;
	GLint				numActiveBlocks	= -1;
	GLchar				uniformBlockName[128];

	deMemset(&uniformBlockName[0], 0, sizeof(uniformBlockName));

	ctx.glGetProgramiv(program.getProgram(), GL_ACTIVE_UNIFORM_BLOCKS, &numActiveBlocks);
	ctx.getLog() << TestLog::Message << "// GL_ACTIVE_UNIFORM_BLOCKS = " << numActiveBlocks << " (expected 1)." << TestLog::EndMessage;
	ctx.expectError(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_OPERATION is generated if program is the name of a shader object.");
	ctx.glGetActiveUniformBlockName(shader, numActiveBlocks, GL_UNIFORM_BLOCK_BINDING, &length, &uniformBlockName[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if program is not the name of either a program or shader object.");
	ctx.glGetActiveUniformBlockName(-1, numActiveBlocks, GL_UNIFORM_BLOCK_BINDING, &length, &uniformBlockName[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if uniformBlockIndex is greater than or equal to the value of GL_ACTIVE_UNIFORM_BLOCKS or is not the index of an active uniform block in program.");
	ctx.glUseProgram(program.getProgram());
	ctx.expectError(GL_NO_ERROR);
	ctx.glGetActiveUniformBlockName(program.getProgram(), numActiveBlocks, (int)sizeof(uniformBlockName), &length, &uniformBlockName[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.glUseProgram(0);
}